

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_node.c
# Opt level: O1

signal_node_t * signal_node_create(void)

{
  signal_node_t *psVar1;
  
  psVar1 = (signal_node_t *)__cilkrts_malloc(0x28);
  psVar1->run = 0;
  sem_init((sem_t *)&psVar1->sem,0,0);
  return psVar1;
}

Assistant:

COMMON_SYSDEP
signal_node_t *signal_node_create(void)
{
     signal_node_t *node;

    node = ( signal_node_t*)
        __cilkrts_malloc(sizeof( signal_node_t));
    node->run = 0;
    initialize_cilk_semaphore(&node->sem);

    return node;
}